

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_strategies.cpp
# Opt level: O1

void __thiscall
Clasp::DynamicLimit::resetAdjust(DynamicLimit *this,float k,Type t,uint32 uLimit,bool resetAvg)

{
  uint uVar1;
  undefined3 in_register_00000009;
  
  (this->adjust).limit = 0;
  (this->adjust).restarts = 0;
  (this->adjust).samples = 0;
  (this->adjust).rk = 0.0;
  (this->adjust).limit = uLimit;
  (this->adjust).rk = k;
  (this->adjust).type = t;
  if (CONCAT31(in_register_00000009,resetAvg) != 0) {
    this->num_ = 0;
    (this->avg_).avg_ = 0.0;
    (this->avg_).pos_ = 0;
    uVar1 = *(uint *)&(this->avg_).field_0x14;
    if ((uVar1 & 0x1fffffff) == 0) {
      (this->avg_).extra_.sma = (uint32 *)0x0;
      return;
    }
    *(uint *)&(this->avg_).field_0x14 = uVar1 & 0xdfffffff;
  }
  return;
}

Assistant:

void DynamicLimit::resetAdjust(float k, Type t, uint32 uLimit, bool resetAvg) {
	std::memset(&adjust, 0, sizeof(adjust));
	adjust.limit = uLimit;
	adjust.rk = k;
	adjust.type = t;
	if (resetAvg) {
		num_ = 0;
		avg_.clear();
	}
}